

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

void __thiscall
PDA::Transducer::Grammar::Rule::addChains<wchar_t[4],wchar_t[4],wchar_t[5],wchar_t[7],wchar_t[7]>
          (Rule *this,wchar_t (*first) [4],wchar_t (*rest) [4],wchar_t (*rest_1) [5],
          wchar_t (*rest_2) [7],wchar_t (*rest_3) [7])

{
  allocator<wchar_t> local_79;
  wstring local_78;
  Chain local_58;
  wchar_t (*local_38) [7];
  wchar_t (*rest_local_3) [7];
  wchar_t (*rest_local_2) [7];
  wchar_t (*rest_local_1) [5];
  wchar_t (*rest_local) [4];
  wchar_t (*first_local) [4];
  Rule *this_local;
  
  local_38 = rest_3;
  rest_local_3 = rest_2;
  rest_local_2 = (wchar_t (*) [7])rest_1;
  rest_local_1 = (wchar_t (*) [5])rest;
  rest_local = first;
  first_local = &this->m_left;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_78,*first,&local_79);
  Chain::Chain(&local_58,&local_78);
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  push_back(&this->m_chains,&local_58);
  Chain::~Chain(&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_78);
  std::allocator<wchar_t>::~allocator(&local_79);
  addChains<wchar_t[4],wchar_t[5],wchar_t[7],wchar_t[7]>
            (this,(wchar_t (*) [4])rest_local_1,(wchar_t (*) [5])rest_local_2,rest_local_3,local_38)
  ;
  return;
}

Assistant:

void addChains(const First &first, const Rest&... rest)
        {
            m_chains.push_back(Chain(first));
            addChains(rest...);
        }